

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::DeviceContextVkImpl::CommitScissorRects(DeviceContextVkImpl *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  PipelineStateVkImpl *this_00;
  GraphicsPipelineDesc *pGVar5;
  ulong uVar6;
  char *Args_1;
  string msg_1;
  VkRect2D VkScissorRects [16];
  string local_138;
  string local_118 [8];
  
  this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.m_pObject;
  if (this_00 != (PipelineStateVkImpl *)0x0) {
    pGVar5 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                       (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    if ((pGVar5->RasterizerDesc).ScissorEnable != false) goto LAB_00288a9d;
  }
  FormatString<char[54]>
            (local_118,(char (*) [54])"Scissor test must be enabled in the graphics pipeline");
  DebugAssertionFailed
            (local_118[0]._M_dataplus._M_p,"CommitScissorRects",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
             ,0x6d6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
    operator_delete(local_118[0]._M_dataplus._M_p,local_118[0].field_2._M_allocated_capacity + 1);
  }
LAB_00288a9d:
  uVar6 = (ulong)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                 super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumScissorRects;
  if (uVar6 != 0) {
    Args_1 = (char *)0x0;
    do {
      iVar1 = *(int *)(*(char (*) [32])Args_1 +
                      (long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_ScissorRects[0]
                             .left);
      iVar2 = *(int *)((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_ScissorRects
                              [0].top + (long)Args_1);
      *(int *)(*(char (*) [32])Args_1 + (long)&local_118[0]._M_dataplus) = iVar1;
      *(int *)(*(char (*) [32])Args_1 + (long)((long)&local_118[0]._M_dataplus._M_p + 4)) = iVar2;
      iVar3 = *(int *)((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_ScissorRects
                              [0].bottom + (long)Args_1);
      *(int *)((long)&local_118[0]._M_string_length + (long)Args_1) =
           *(int *)((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_ScissorRects[0].
                           right + (long)Args_1) - iVar1;
      *(int *)((undefined1 *)((long)&local_118[0]._M_string_length + 4) + (long)Args_1) =
           iVar3 - iVar2;
      Args_1 = *(char (*) [32])Args_1 + 0x10;
    } while ((char *)(uVar6 << 4) != Args_1);
    EnsureVkCmdBuffer(this);
    uVar4 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumScissorRects;
    if ((this->m_CommandBuffer).m_VkCmdBuffer == (VkCommandBuffer)0x0) {
      FormatString<char[26],char[32]>
                (&local_138,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])Args_1);
      DebugAssertionFailed
                (local_138._M_dataplus._M_p,"SetScissorRects",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
                 ,0x1bd);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
    (*vkCmdSetScissor)((this->m_CommandBuffer).m_VkCmdBuffer,0,uVar4,(VkRect2D *)local_118);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::CommitScissorRects()
{
    VERIFY(m_pPipelineState && m_pPipelineState->GetGraphicsPipelineDesc().RasterizerDesc.ScissorEnable, "Scissor test must be enabled in the graphics pipeline");

    if (m_NumScissorRects == 0)
        return; // Scissors have not been set in the context yet

    VkRect2D VkScissorRects[MAX_VIEWPORTS]; // Do not waste time initializing array with zeroes
    for (Uint32 sr = 0; sr < m_NumScissorRects; ++sr)
    {
        const Rect& SrcRect       = m_ScissorRects[sr];
        VkScissorRects[sr].offset = {SrcRect.left, SrcRect.top};
        VkScissorRects[sr].extent = {static_cast<uint32_t>(SrcRect.right - SrcRect.left), static_cast<uint32_t>(SrcRect.bottom - SrcRect.top)};
    }

    EnsureVkCmdBuffer();
    // TODO: reinterpret_cast m_Viewports to m_Viewports?
    m_CommandBuffer.SetScissorRects(0, m_NumScissorRects, VkScissorRects);
}